

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_casting.hpp
# Opt level: O2

bool duckdb::CSVCast::
     TemplatedTryCastDateVector<duckdb::CSVCast::TryCastDateOperator,duckdb::date_t>
               (map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
                *options,Vector *input_vector,Vector *result_vector,idx_t count,
               CastParameters *parameters,idx_t *line_error,bool nullify_error)

{
  bool nullify_error_local;
  bool all_converted;
  idx_t local_78;
  idx_t cur_line;
  map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
  *local_68;
  CastParameters *local_60;
  bool *local_58;
  idx_t *local_50;
  idx_t *local_48;
  bool *local_40;
  ValidityMask *local_38;
  
  nullify_error_local = nullify_error;
  all_converted = true;
  cur_line = 0;
  local_78 = count;
  FlatVector::VerifyFlatVector(result_vector);
  local_38 = &result_vector->validity;
  local_48 = &cur_line;
  local_40 = &nullify_error_local;
  local_68 = options;
  local_60 = parameters;
  local_58 = &all_converted;
  local_50 = line_error;
  UnaryExecutor::
  ExecuteStandard<duckdb::string_t,duckdb::date_t,duckdb::UnaryLambdaWrapper,duckdb::CSVCast::TemplatedTryCastDateVector<duckdb::CSVCast::TryCastDateOperator,duckdb::date_t>(std::map<duckdb::LogicalTypeId,duckdb::CSVOption<duckdb::StrpTimeFormat>,std::less<duckdb::LogicalTypeId>,std::allocator<std::pair<duckdb::LogicalTypeId_const,duckdb::CSVOption<duckdb::StrpTimeFormat>>>>const&,duckdb::Vector&,duckdb::Vector&,unsigned_long,duckdb::CastParameters&,unsigned_long&,bool)::_lambda(duckdb::string_t)_1_>
            (input_vector,result_vector,local_78,&local_68,false,CAN_THROW_RUNTIME_ERROR);
  return all_converted;
}

Assistant:

static bool TemplatedTryCastDateVector(const map<LogicalTypeId, CSVOption<StrpTimeFormat>> &options,
	                                       Vector &input_vector, Vector &result_vector, idx_t count,
	                                       CastParameters &parameters, idx_t &line_error, bool nullify_error) {
		D_ASSERT(input_vector.GetType().id() == LogicalTypeId::VARCHAR);
		bool all_converted = true;
		idx_t cur_line = 0;
		auto &validity_mask = FlatVector::Validity(result_vector);
		UnaryExecutor::Execute<string_t, T>(input_vector, result_vector, count, [&](string_t input) {
			T result;
			if (!OP::Operation(options, input, result, *parameters.error_message)) {
				if (all_converted) {
					line_error = cur_line;
				}
				if (nullify_error) {
					validity_mask.SetInvalid(cur_line);
				}
				all_converted = false;
			}
			cur_line++;
			return result;
		});
		return all_converted;
	}